

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluMinimumBase(word *t,int *pSupp,int nVarsAll,int *pnVars)

{
  int iVar1;
  uint local_3c;
  int local_38;
  int uSupp;
  int iVar;
  int v;
  int *pnVars_local;
  int nVarsAll_local;
  int *pSupp_local;
  word *t_local;
  
  local_38 = 0;
  local_3c = 0;
  if (0x10 < nVarsAll) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x5ff,"int If_CluMinimumBase(word *, int *, int, int *)");
  }
  for (uSupp = 0; uSupp < nVarsAll; uSupp = uSupp + 1) {
    iVar1 = If_CluHasVar(t,nVarsAll,uSupp);
    if (iVar1 != 0) {
      local_3c = 1 << ((byte)uSupp & 0x1f) | local_3c;
      if (pSupp != (int *)0x0) {
        pSupp[local_38] = pSupp[uSupp];
      }
      local_38 = local_38 + 1;
    }
  }
  if (pnVars != (int *)0x0) {
    *pnVars = local_38;
  }
  iVar1 = If_CluSuppIsMinBase(local_3c);
  if (iVar1 == 0) {
    If_CluTruthShrink(t,local_38,nVarsAll,local_3c);
  }
  t_local._4_4_ = (uint)(iVar1 == 0);
  return t_local._4_4_;
}

Assistant:

int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 16 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( If_CluHasVar( t, nVarsAll, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( If_CluSuppIsMinBase( uSupp ) )
        return 0;
    If_CluTruthShrink( t, iVar, nVarsAll, uSupp );
    return 1;
}